

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O0

char * get_opt_value(char *line)

{
  size_t sVar1;
  char *pcVar2;
  ulong local_20;
  size_t i;
  char *line_local;
  
  local_20 = 0;
  while( true ) {
    sVar1 = strlen(line);
    if (sVar1 <= local_20) {
      return (char *)0x0;
    }
    if (line[local_20] == ':') break;
    local_20 = local_20 + 1;
  }
  pcVar2 = string_trim(line + local_20 + 1);
  return pcVar2;
}

Assistant:

static char *get_opt_value(char *line)
{
    size_t i;

    for (i = 0; i < strlen(line); ++i) {
        if (line[i] == ':')
            return string_trim(&line[i + 1]);
    }

    return NULL;
}